

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O3

bool __thiscall
irr::video::COpenGLDriver::setRenderTargetEx
          (COpenGLDriver *this,IRenderTarget *target,u16 clearFlag,SColor clearColor,f32 clearDepth,
          u8 clearStencil)

{
  GLuint GVar1;
  COpenGLCacheHandler *pCVar2;
  COpenGLDriver *pCVar3;
  IRenderTarget *pIVar4;
  ITexture *texture;
  COpenGLCoreTexture<irr::video::COpenGLDriver> *texture_00;
  ushort uVar5;
  code *pcVar6;
  ulong uVar7;
  pointer ppIVar8;
  COpenGLRenderTarget *renderTarget;
  ulong uVar9;
  bool bVar10;
  undefined4 in_XMM0_Db;
  
  if (target == (IRenderTarget *)0x0) {
    bVar10 = this->field_0x6c1 == '\0';
    if (bVar10) {
      pIVar4 = (this->super_CNullDriver).CurrentRenderTarget;
      ppIVar8 = (pIVar4->Textures).m_data.
                super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar9 = (ulong)((long)(pIVar4->Textures).m_data.
                            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar8) >> 3;
      if ((int)uVar9 != 0) {
        uVar7 = 0;
        do {
          texture = ppIVar8[uVar7];
          if (texture != (ITexture *)0x0) {
            texture_00 = (this->CacheHandler->
                         super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                         ).TextureCache.Texture[0];
            COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
            ::STextureCache::set
                      (&(this->CacheHandler->
                        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                        ).TextureCache,0,texture,EST_ACTIVE_ALWAYS);
            glCopyTexSubImage2D(0xde1,0,0,0,0,0,(texture->Size).Width,(texture->Size).Height);
            COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
            ::STextureCache::set
                      (&(this->CacheHandler->
                        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                        ).TextureCache,0,&texture_00->super_ITexture,EST_ACTIVE_ALWAYS);
            break;
          }
          uVar7 = uVar7 + 1;
        } while ((uVar9 & 0xffffffff) != uVar7);
      }
    }
    else {
      pCVar2 = this->CacheHandler;
      if ((pCVar2->
          super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ).FrameBufferID != 0) {
        pCVar3 = (pCVar2->
                 super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                 ).Driver;
        pcVar6 = *(code **)&pCVar3->field_0x8f8;
        if ((pcVar6 != (code *)0x0) ||
           (pcVar6 = *(code **)&pCVar3->field_0x950, pcVar6 != (code *)0x0)) {
          (*pcVar6)(0x8d40,0);
        }
        (pCVar2->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).FrameBufferID = 0;
      }
    }
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x83])
              (this,(ulong)(this->super_CNullDriver).ScreenSize.Width,
               (ulong)(this->super_CNullDriver).ScreenSize.Height);
    ppIVar8 = (pointer)0x0;
    uVar9 = 0;
  }
  else {
    if (target->DriverType != EDT_OPENGL) {
      os::Printer::log((Printer *)
                       "Fatal Error: Tried to set a render target not owned by this driver.",
                       (double)CONCAT44(in_XMM0_Db,clearDepth));
      return false;
    }
    bVar10 = this->field_0x6c1 == '\0';
    if (!bVar10) {
      pCVar2 = this->CacheHandler;
      GVar1 = *(GLuint *)
               ((long)&target[1].Textures.m_data.
                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4);
      if ((pCVar2->
          super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
          ).FrameBufferID != GVar1) {
        pCVar3 = (pCVar2->
                 super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                 ).Driver;
        pcVar6 = *(code **)&pCVar3->field_0x8f8;
        if ((pcVar6 != (code *)0x0) ||
           (pcVar6 = *(code **)&pCVar3->field_0x950, pcVar6 != (code *)0x0)) {
          (*pcVar6)(0x8d40,GVar1);
        }
        (pCVar2->
        super_COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
        ).FrameBufferID = GVar1;
      }
      COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::update((COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                *)target);
    }
    ppIVar8 = target[1].Textures.m_data.
              super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar9 = (ulong)ppIVar8 >> 0x20;
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x83])
              (this,(ulong)ppIVar8 & 0xffffffff,uVar9);
  }
  if (((this->super_CNullDriver).CurrentRenderTargetSize.Width != (uint)ppIVar8) ||
     ((this->super_CNullDriver).CurrentRenderTargetSize.Height != (uint)uVar9)) {
    (this->super_CNullDriver).CurrentRenderTargetSize =
         (dimension2d<unsigned_int>)((ulong)ppIVar8 & 0xffffffff | uVar9 << 0x20);
    this->Transformation3DChanged = true;
  }
  (this->super_CNullDriver).CurrentRenderTarget = target;
  uVar5 = clearFlag | 3;
  if (!bVar10) {
    uVar5 = clearFlag;
  }
  (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x57])
            ((ulong)(uint)clearDepth,this,(ulong)uVar5,(ulong)clearColor.color,clearStencil);
  return true;
}

Assistant:

bool COpenGLDriver::setRenderTargetEx(IRenderTarget *target, u16 clearFlag, SColor clearColor, f32 clearDepth, u8 clearStencil)
{
	if (target && target->getDriverType() != EDT_OPENGL) {
		os::Printer::log("Fatal Error: Tried to set a render target not owned by this driver.", ELL_ERROR);
		return false;
	}

	bool supportForFBO = (Feature.ColorAttachment > 0);

	core::dimension2d<u32> destRenderTargetSize(0, 0);

	if (target) {
		COpenGLRenderTarget *renderTarget = static_cast<COpenGLRenderTarget *>(target);

		if (supportForFBO) {
			CacheHandler->setFBO(renderTarget->getBufferID());
			renderTarget->update();
		}

		destRenderTargetSize = renderTarget->getSize();

		setViewPortRaw(destRenderTargetSize.Width, destRenderTargetSize.Height);
	} else {
		if (supportForFBO)
			CacheHandler->setFBO(0);
		else {
			COpenGLRenderTarget *prevRenderTarget = static_cast<COpenGLRenderTarget *>(CurrentRenderTarget);
			COpenGLTexture *renderTargetTexture = static_cast<COpenGLTexture *>(prevRenderTarget->getTexture());

			if (renderTargetTexture) {
				const COpenGLTexture *prevTexture = CacheHandler->getTextureCache()[0];

				CacheHandler->getTextureCache().set(0, renderTargetTexture);

				const core::dimension2d<u32> size = renderTargetTexture->getSize();
				glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 0, 0, size.Width, size.Height);

				CacheHandler->getTextureCache().set(0, prevTexture);
			}
		}

		destRenderTargetSize = core::dimension2d<u32>(0, 0);

		setViewPortRaw(ScreenSize.Width, ScreenSize.Height);
	}

	if (CurrentRenderTargetSize != destRenderTargetSize) {
		CurrentRenderTargetSize = destRenderTargetSize;

		Transformation3DChanged = true;
	}

	CurrentRenderTarget = target;

	if (!supportForFBO) {
		clearFlag |= ECBF_COLOR;
		clearFlag |= ECBF_DEPTH;
	}

	clearBuffers(clearFlag, clearColor, clearDepth, clearStencil);

	return true;
}